

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O1

int check_lookbehinds(uint32_t *pptr,uint32_t **retptr,parsed_recurse_check *recurses,
                     compile_block_8 *cb,int *lcptr)

{
  uint32_t uVar1;
  BOOL BVar2;
  int errorcode;
  uint32_t *local_48;
  int local_40;
  int local_3c;
  uint32_t **local_38;
  
  local_40 = 0;
  cb->erroroffset = 0xffffffffffffffff;
  uVar1 = *pptr;
  local_3c = 0;
  local_48 = pptr;
  local_38 = retptr;
  do {
    if (-1 < (int)uVar1) goto switchD_00141d74_caseD_0;
    switch(uVar1 + 0x7fff0000 >> 0x10) {
    case 0:
    case 2:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0x15:
    case 0x16:
    case 0x1d:
    case 0x1e:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2d:
    case 0x2f:
    case 0x31:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x3a:
    case 0x3b:
      break;
    case 1:
    case 7:
    case 0xe:
    case 0x19:
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x26:
      goto switchD_00141d74_caseD_1;
    case 3:
    case 5:
    case 0x20:
      local_48 = local_48 + 3;
      break;
    case 4:
    case 0x1b:
    case 0x1c:
switchD_00141d74_caseD_4:
      local_48 = local_48 + 1;
      break;
    case 6:
      local_48 = local_48 + 5;
      break;
    case 0xf:
      local_48 = local_48 + 2;
      goto switchD_00141d74_caseD_1;
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
      local_48 = local_48 + 3;
switchD_00141d74_caseD_1:
      local_3c = local_3c + 1;
      break;
    case 0x17:
      if (uVar1 + 0x7fe7fff1 < 2) goto switchD_00141d74_caseD_4;
      break;
    case 0x18:
      if (local_3c < 1) {
        if (local_38 == (uint32_t **)0x0) {
          return 0;
        }
        *local_38 = local_48;
        return 0;
      }
      local_3c = local_3c + -1;
      break;
    case 0x1a:
    case 0x1f:
    case 0x3c:
    case 0x3d:
    case 0x3e:
      local_48 = local_48 + 2;
      break;
    case 0x24:
    case 0x25:
    case 0x27:
      BVar2 = set_lookbehind_lengths(&local_48,&local_40,lcptr,recurses,cb);
      if (BVar2 == 0) {
        return local_40;
      }
      break;
    case 0x28:
    case 0x2c:
    case 0x2e:
    case 0x30:
    case 0x32:
      local_48 = local_48 + (local_48[1] + 1);
      break;
    default:
      return 0xaa;
    }
switchD_00141d74_caseD_0:
    uVar1 = local_48[1];
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

static int
check_lookbehinds(uint32_t *pptr, uint32_t **retptr,
  parsed_recurse_check *recurses, compile_block *cb, int *lcptr)
{
int errorcode = 0;
int nestlevel = 0;

cb->erroroffset = PCRE2_UNSET;

for (; *pptr != META_END; pptr++)
  {
  if (*pptr < META_END) continue;  /* Literal */

  switch (META_CODE(*pptr))
    {
    default:
    return ERR70;  /* Unrecognized meta code */

    case META_ESCAPE:
    if (*pptr - META_ESCAPE == ESC_P || *pptr - META_ESCAPE == ESC_p)
      pptr += 1;
    break;

    case META_KET:
    if (--nestlevel < 0)
      {
      if (retptr != NULL) *retptr = pptr;
      return 0;
      }
    break;

    case META_ATOMIC:
    case META_CAPTURE:
    case META_COND_ASSERT:
    case META_LOOKAHEAD:
    case META_LOOKAHEADNOT:
    case META_LOOKAHEAD_NA:
    case META_NOCAPTURE:
    case META_SCRIPT_RUN:
    nestlevel++;
    break;

    case META_ACCEPT:
    case META_ALT:
    case META_ASTERISK:
    case META_ASTERISK_PLUS:
    case META_ASTERISK_QUERY:
    case META_BACKREF:
    case META_CIRCUMFLEX:
    case META_CLASS:
    case META_CLASS_EMPTY:
    case META_CLASS_EMPTY_NOT:
    case META_CLASS_END:
    case META_CLASS_NOT:
    case META_COMMIT:
    case META_DOLLAR:
    case META_DOT:
    case META_FAIL:
    case META_PLUS:
    case META_PLUS_PLUS:
    case META_PLUS_QUERY:
    case META_PRUNE:
    case META_QUERY:
    case META_QUERY_PLUS:
    case META_QUERY_QUERY:
    case META_RANGE_ESCAPED:
    case META_RANGE_LITERAL:
    case META_SKIP:
    case META_THEN:
    break;

    case META_RECURSE:
    pptr += SIZEOFFSET;
    break;

    case META_BACKREF_BYNAME:
    case META_RECURSE_BYNAME:
    pptr += 1 + SIZEOFFSET;
    break;

    case META_COND_DEFINE:
    pptr += SIZEOFFSET;
    nestlevel++;
    break;

    case META_COND_NAME:
    case META_COND_NUMBER:
    case META_COND_RNAME:
    case META_COND_RNUMBER:
    pptr += 1 + SIZEOFFSET;
    nestlevel++;
    break;

    case META_COND_VERSION:
    pptr += 3;
    nestlevel++;
    break;

    case META_CALLOUT_STRING:
    pptr += 3 + SIZEOFFSET;
    break;

    case META_BIGVALUE:
    case META_POSIX:
    case META_POSIX_NEG:
    pptr += 1;
    break;

    case META_MINMAX:
    case META_MINMAX_QUERY:
    case META_MINMAX_PLUS:
    case META_OPTIONS:
    pptr += 2;
    break;

    case META_CALLOUT_NUMBER:
    pptr += 3;
    break;

    case META_MARK:
    case META_COMMIT_ARG:
    case META_PRUNE_ARG:
    case META_SKIP_ARG:
    case META_THEN_ARG:
    pptr += 1 + pptr[1];
    break;

    case META_LOOKBEHIND:
    case META_LOOKBEHINDNOT:
    case META_LOOKBEHIND_NA:
    if (!set_lookbehind_lengths(&pptr, &errorcode, lcptr, recurses, cb))
      return errorcode;
    break;
    }
  }

return 0;
}